

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O0

int run_server(sockaddr *sa,socklen_t salen,ptls_context_t *ctx,char *input_file,
              ptls_handshake_properties_t *hsprop,int request_key_update)

{
  FILE *__stream;
  uint16_t uVar1;
  int iVar2;
  undefined4 local_48;
  int local_44;
  int on;
  int conn_fd;
  int listen_fd;
  int request_key_update_local;
  ptls_handshake_properties_t *hsprop_local;
  char *input_file_local;
  ptls_context_t *ctx_local;
  sockaddr *psStack_18;
  socklen_t salen_local;
  sockaddr *sa_local;
  
  local_48 = 1;
  conn_fd = request_key_update;
  _listen_fd = hsprop;
  hsprop_local = (ptls_handshake_properties_t *)input_file;
  input_file_local = (char *)ctx;
  ctx_local._4_4_ = salen;
  psStack_18 = sa;
  on = socket((uint)sa->sa_family,1,0);
  if (on == -1) {
    perror("socket(2) failed");
  }
  else {
    iVar2 = setsockopt(on,1,2,&local_48,4);
    if (iVar2 == 0) {
      iVar2 = bind(on,(sockaddr *)psStack_18,ctx_local._4_4_);
      if (iVar2 == 0) {
        iVar2 = listen(on,0x1000);
        __stream = _stderr;
        if (iVar2 == 0) {
          uVar1 = ntohs(*(uint16_t *)((sockaddr *)psStack_18)->sa_data);
          fprintf(__stream,"server started on port %d\n",(ulong)uVar1);
          do {
            do {
              fprintf(_stderr,"waiting for connections\n");
              local_44 = accept(on,(sockaddr *)0x0,(socklen_t *)0x0);
            } while (local_44 == -1);
            handle_connection(local_44,(ptls_context_t *)input_file_local,(char *)0x0,
                              (char *)hsprop_local,_listen_fd,conn_fd,0);
          } while( true );
        }
        perror("listen(2) failed");
      }
      else {
        perror("bind(2) failed");
      }
    }
    else {
      perror("setsockopt(SO_REUSEADDR) failed");
    }
  }
  return 1;
}

Assistant:

static int run_server(struct sockaddr *sa, socklen_t salen, ptls_context_t *ctx, const char *input_file,
                      ptls_handshake_properties_t *hsprop, int request_key_update)
{
    int listen_fd, conn_fd, on = 1;

    if ((listen_fd = socket(sa->sa_family, SOCK_STREAM, 0)) == -1) {
        perror("socket(2) failed");
        return 1;
    }
    if (setsockopt(listen_fd, SOL_SOCKET, SO_REUSEADDR, &on, sizeof(on)) != 0) {
        perror("setsockopt(SO_REUSEADDR) failed");
        return 1;
    }
    if (bind(listen_fd, sa, salen) != 0) {
        perror("bind(2) failed");
        return 1;
    }
    if (listen(listen_fd, SOMAXCONN) != 0) {
        perror("listen(2) failed");
        return 1;
    }

    fprintf(stderr, "server started on port %d\n", ntohs(((struct sockaddr_in *)sa)->sin_port));
    while (1) {
        fprintf(stderr, "waiting for connections\n");
        if ((conn_fd = accept(listen_fd, NULL, 0)) != -1)
            handle_connection(conn_fd, ctx, NULL, input_file, hsprop, request_key_update, 0);
    }

    return 0;
}